

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram_test.c
# Opt level: O3

char * test_interval_recording(void)

{
  int iVar1;
  hdr_histogram *phVar2;
  char *pcVar3;
  int iVar4;
  long value;
  hdr_histogram *expected_corrected_histogram;
  hdr_histogram *expected_histogram;
  hdr_interval_recorder recorder_corrected;
  hdr_interval_recorder recorder;
  hdr_histogram *local_90;
  hdr_histogram *local_88;
  hdr_interval_recorder local_80;
  hdr_interval_recorder local_50;
  
  hdr_interval_recorder_init_all(&local_50,1,86400000000,3);
  hdr_interval_recorder_init_all(&local_80,1,86400000000,3);
  hdr_init(1,86400000000,3,&local_88);
  hdr_init(1,86400000000,3,&local_90);
  iVar4 = 1000000;
  do {
    iVar1 = rand();
    value = (long)(iVar1 % 20000);
    hdr_record_value(local_88,value);
    hdr_record_corrected_value(local_90,value,1000);
    hdr_interval_recorder_record_value(&local_50,value);
    hdr_interval_recorder_record_corrected_value(&local_80,value,1000);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  phVar2 = hdr_interval_recorder_sample(&local_50);
  pcVar3 = compare_histograms(local_88,phVar2);
  if (pcVar3 == (char *)0x0) {
    phVar2 = hdr_interval_recorder_sample(&local_80);
    pcVar3 = compare_histograms(local_90,phVar2);
  }
  return pcVar3;
}

Assistant:

static char* test_interval_recording(void)
{
    int value_count, i, value;
    char* result;
    struct hdr_histogram* expected_histogram;
    struct hdr_histogram* expected_corrected_histogram;
    struct hdr_interval_recorder recorder;
    struct hdr_interval_recorder recorder_corrected;
    struct hdr_histogram* recorder_histogram;
    struct hdr_histogram* recorder_corrected_histogram;

    value_count = 1000000;
    hdr_interval_recorder_init_all(&recorder, 1, INT64_C(24) * 60 * 60 * 1000000, 3);
    hdr_interval_recorder_init_all(&recorder_corrected, 1, INT64_C(24) * 60 * 60 * 1000000, 3);
    hdr_init(1, INT64_C(24) * 60 * 60 * 1000000, 3, &expected_histogram);
    hdr_init(1, INT64_C(24) * 60 * 60 * 1000000, 3, &expected_corrected_histogram);

    for (i = 0; i < value_count; i++)
    {
        value = rand() % 20000;
        hdr_record_value(expected_histogram, value);
        hdr_record_corrected_value(expected_corrected_histogram, value, 1000);
        hdr_interval_recorder_record_value(&recorder, value);
        hdr_interval_recorder_record_corrected_value(&recorder_corrected, value, 1000);
    }

    recorder_histogram = hdr_interval_recorder_sample(&recorder);

    result = compare_histograms(expected_histogram, recorder_histogram);
    if (result)
    {
        return result;
    }

    recorder_corrected_histogram = hdr_interval_recorder_sample(&recorder_corrected);
    result = compare_histograms(expected_corrected_histogram, recorder_corrected_histogram);
    if (result)
    {
        return result;
    }

    return 0;
}